

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCompareSkip(Expr *pA,Expr *pB,int iTab)

{
  int iVar1;
  Expr *pA_00;
  Expr *pB_00;
  
  pA_00 = sqlite3ExprSkipCollate(pA);
  pB_00 = sqlite3ExprSkipCollate(pB);
  iVar1 = sqlite3ExprCompare((Parse *)0x0,pA_00,pB_00,iTab);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompareSkip(Expr *pA, Expr *pB, int iTab){
  return sqlite3ExprCompare(0,
             sqlite3ExprSkipCollate(pA),
             sqlite3ExprSkipCollate(pB),
             iTab);
}